

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O0

void __thiscall Encode::quickSortProbability(Encode *this,int L,int R)

{
  double dVar1;
  reference pvVar2;
  reference __b;
  reference __a;
  reference __b_00;
  double temp;
  int j;
  int i;
  int R_local;
  int L_local;
  Encode *this_local;
  
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&this->m_probabilities,(long)((L + R) / 2));
  dVar1 = *pvVar2;
  temp._0_4_ = R;
  temp._4_4_ = L;
  while (temp._4_4_ <= temp._0_4_) {
    while (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&this->m_probabilities,(long)temp._4_4_), dVar1 < *pvVar2) {
      temp._4_4_ = temp._4_4_ + 1;
    }
    while (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&this->m_probabilities,(long)temp._0_4_), *pvVar2 < dVar1) {
      temp._0_4_ = temp._0_4_ + -1;
    }
    if (temp._4_4_ <= temp._0_4_) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->m_probabilities,(long)temp._4_4_);
      __b = std::vector<double,_std::allocator<double>_>::operator[]
                      (&this->m_probabilities,(long)temp._0_4_);
      std::swap<double>(pvVar2,__b);
      __a = std::vector<char,_std::allocator<char>_>::operator[](&this->m_data,(long)temp._4_4_);
      __b_00 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_data,(long)temp._0_4_);
      std::swap<char>(__a,__b_00);
      temp._4_4_ = temp._4_4_ + 1;
      temp._0_4_ = temp._0_4_ + -1;
    }
  }
  if (L < temp._0_4_) {
    quickSortProbability(this,L,temp._0_4_);
  }
  if (temp._4_4_ < R) {
    quickSortProbability(this,temp._4_4_,R);
  }
  return;
}

Assistant:

void quickSortProbability(int L, int R) {
        int i = L;
        int j = R;
        double temp = m_probabilities[(i + j) / 2];
        while (i <= j) {
            while (m_probabilities[i] > temp) {
                i++;
            }
            while (m_probabilities[j] < temp) {
                j--;
            }
            if (i <= j) {
                swap(m_probabilities[i], m_probabilities[j]);
                swap(m_data[i], m_data[j]);
                i++;
                j--;
            }
        }
        if (L < j) {
            quickSortProbability(L, j);
        }
        if (i < R) {
            quickSortProbability(i, R);
        }
    }